

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

bool __thiscall OpenGliderConnection::APRSDoLogin(OpenGliderConnection *this)

{
  double dVar1;
  double dVar2;
  int __flags;
  double *pdVar3;
  ssize_t sVar4;
  size_t __n;
  void *__buf;
  long in_RDI;
  float fVar5;
  char sLogin [120];
  bool in_stack_0000014f;
  long in_stack_00000150;
  char *in_stack_00000158;
  LTOnlineChannel *in_stack_00000160;
  DataRefs *this_00;
  
  this_00 = (DataRefs *)&stack0xffffffffffffff78;
  pdVar3 = positionTy::lat((positionTy *)(in_RDI + 0x248));
  dVar1 = *pdVar3;
  pdVar3 = positionTy::lon((positionTy *)(in_RDI + 0x248));
  dVar2 = *pdVar3;
  __flags = DataRefs::GetFdStdDistance_km(&dataRefs);
  snprintf((char *)this_00,0x78,
           "user LiveTrffc pass -1 vers LiveTraffic %s filter r/%.3f/%.3f/%u -p/oimqstunw\r\n",dVar1
           ,dVar2,LT_VERSION);
  fVar5 = DataRefs::GetMiscNetwTime(this_00);
  *(float *)(in_RDI + 700) = fVar5;
  __n = 1;
  LTOnlineChannel::DebugLogRaw
            (in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_0000014f);
  sVar4 = XPMP2::TCPConnection::send
                    ((TCPConnection *)(in_RDI + 0x1e8),(int)&stack0xffffffffffffff78,__buf,__n,
                     __flags);
  return (bool)((byte)sVar4 & 1);
}

Assistant:

bool OpenGliderConnection::APRSDoLogin ()
{
    // Prepare login string like "user LiveTrffc pass -1 vers LiveTraffic 2.20 filter r/43.3/-80.2/50 -p/oimqstunw"
    char sLogin[120];
    snprintf(sLogin, sizeof(sLogin), OGN_APRS_LOGIN, LT_VERSION,
             aprsPos.lat(), aprsPos.lon(),
             (unsigned)dataRefs.GetFdStdDistance_km());
    aprsLastKeepAlive = dataRefs.GetMiscNetwTime();     // also counts as a message sent _to_ APRS
    DebugLogRaw(sLogin, HTTP_FLAG_SENDING);
    return tcpAprs.send(sLogin);
}